

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data_collection_segment.cpp
# Opt level: O3

void __thiscall
duckdb::ColumnDataCollectionSegment::AllocateNewChunk(ColumnDataCollectionSegment *this)

{
  reference type;
  size_type __n;
  VectorDataIndex vector_idx;
  VectorDataIndex local_90;
  ChunkMetaData local_88;
  
  local_88.block_ids._M_h._M_buckets = &local_88.block_ids._M_h._M_single_bucket;
  local_88.vector_data.
  super_vector<duckdb::VectorDataIndex,_std::allocator<duckdb::VectorDataIndex>_>.
  super__Vector_base<duckdb::VectorDataIndex,_std::allocator<duckdb::VectorDataIndex>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.vector_data.
  super_vector<duckdb::VectorDataIndex,_std::allocator<duckdb::VectorDataIndex>_>.
  super__Vector_base<duckdb::VectorDataIndex,_std::allocator<duckdb::VectorDataIndex>_>._M_impl.
  super__Vector_impl_data._M_finish = (VectorDataIndex *)0x0;
  local_88.vector_data.
  super_vector<duckdb::VectorDataIndex,_std::allocator<duckdb::VectorDataIndex>_>.
  super__Vector_base<duckdb::VectorDataIndex,_std::allocator<duckdb::VectorDataIndex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (VectorDataIndex *)0x0;
  local_88.block_ids._M_h._M_bucket_count = 1;
  local_88.block_ids._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_88.block_ids._M_h._M_element_count = 0;
  local_88.block_ids._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_88.block_ids._M_h._M_rehash_policy._M_next_resize = 0;
  local_88.block_ids._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_88.count = 0;
  ::std::vector<duckdb::VectorDataIndex,_std::allocator<duckdb::VectorDataIndex>_>::reserve
            ((vector<duckdb::VectorDataIndex,_std::allocator<duckdb::VectorDataIndex>_> *)&local_88,
             ((long)(this->types).
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->types).
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  if ((this->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      type = vector<duckdb::LogicalType,_true>::operator[](&this->types,__n);
      local_90 = AllocateVector(this,type,&local_88,(ChunkManagementState *)0x0,
                                (VectorDataIndex)0xffffffffffffffff);
      if (local_88.vector_data.
          super_vector<duckdb::VectorDataIndex,_std::allocator<duckdb::VectorDataIndex>_>.
          super__Vector_base<duckdb::VectorDataIndex,_std::allocator<duckdb::VectorDataIndex>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          local_88.vector_data.
          super_vector<duckdb::VectorDataIndex,_std::allocator<duckdb::VectorDataIndex>_>.
          super__Vector_base<duckdb::VectorDataIndex,_std::allocator<duckdb::VectorDataIndex>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<duckdb::VectorDataIndex,std::allocator<duckdb::VectorDataIndex>>::
        _M_realloc_insert<duckdb::VectorDataIndex_const&>
                  ((vector<duckdb::VectorDataIndex,std::allocator<duckdb::VectorDataIndex>> *)
                   &local_88,
                   (iterator)
                   local_88.vector_data.
                   super_vector<duckdb::VectorDataIndex,_std::allocator<duckdb::VectorDataIndex>_>.
                   super__Vector_base<duckdb::VectorDataIndex,_std::allocator<duckdb::VectorDataIndex>_>
                   ._M_impl.super__Vector_impl_data._M_finish,&local_90);
      }
      else {
        (local_88.vector_data.
         super_vector<duckdb::VectorDataIndex,_std::allocator<duckdb::VectorDataIndex>_>.
         super__Vector_base<duckdb::VectorDataIndex,_std::allocator<duckdb::VectorDataIndex>_>.
         _M_impl.super__Vector_impl_data._M_finish)->index = local_90.index;
        local_88.vector_data.
        super_vector<duckdb::VectorDataIndex,_std::allocator<duckdb::VectorDataIndex>_>.
        super__Vector_base<duckdb::VectorDataIndex,_std::allocator<duckdb::VectorDataIndex>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_88.vector_data.
             super_vector<duckdb::VectorDataIndex,_std::allocator<duckdb::VectorDataIndex>_>.
             super__Vector_base<duckdb::VectorDataIndex,_std::allocator<duckdb::VectorDataIndex>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
      }
      __n = __n + 1;
    } while (__n < (ulong)(((long)(this->types).
                                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  .
                                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->types).
                                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  .
                                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          -0x5555555555555555));
  }
  ::std::vector<duckdb::ChunkMetaData,_std::allocator<duckdb::ChunkMetaData>_>::
  emplace_back<duckdb::ChunkMetaData>
            (&(this->chunk_data).
              super_vector<duckdb::ChunkMetaData,_std::allocator<duckdb::ChunkMetaData>_>,&local_88)
  ;
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_88.block_ids._M_h);
  if (local_88.vector_data.
      super_vector<duckdb::VectorDataIndex,_std::allocator<duckdb::VectorDataIndex>_>.
      super__Vector_base<duckdb::VectorDataIndex,_std::allocator<duckdb::VectorDataIndex>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.vector_data.
                    super_vector<duckdb::VectorDataIndex,_std::allocator<duckdb::VectorDataIndex>_>.
                    super__Vector_base<duckdb::VectorDataIndex,_std::allocator<duckdb::VectorDataIndex>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ColumnDataCollectionSegment::AllocateNewChunk() {
	ChunkMetaData meta_data;
	meta_data.count = 0;
	meta_data.vector_data.reserve(types.size());
	for (idx_t i = 0; i < types.size(); i++) {
		auto vector_idx = AllocateVector(types[i], meta_data);
		meta_data.vector_data.push_back(vector_idx);
	}
	chunk_data.push_back(std::move(meta_data));
}